

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O3

string_t __thiscall
duckdb::VectorStringCastOperator<duckdb::VarIntCastToVarchar>::
Operation<duckdb::string_t,duckdb::string_t>
          (VectorStringCastOperator<duckdb::VarIntCastToVarchar> *this,string_t input,
          ValidityMask *mask,idx_t idx,void *dataptr)

{
  _Alloc_hider _Var1;
  anon_union_16_2_67f50693_for_value aVar2;
  string_t data;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 local_44;
  string local_40;
  VectorStringCastOperator<duckdb::VarIntCastToVarchar> *local_20;
  undefined8 local_18;
  
  local_18 = input.value._0_8_;
  local_20 = this;
  Varint::VarIntToVarchar_abi_cxx11_(&local_40,(Varint *)&local_20,input.value._8_8_);
  if ((uint)local_40._M_string_length < 0xd) {
    local_44 = 0;
    uStack_4c = 0;
    uStack_48 = 0;
    if ((uint)local_40._M_string_length == 0) {
      _Var1._M_p = (pointer)0x0;
    }
    else {
      switchD_00b03519::default
                (&uStack_4c,local_40._M_dataplus._M_p,(ulong)((uint)local_40._M_string_length & 0xf)
                );
      _Var1._M_p = (pointer)CONCAT44(local_44,uStack_48);
    }
  }
  else {
    uStack_4c = *(undefined4 *)local_40._M_dataplus._M_p;
    _Var1._M_p = local_40._M_dataplus._M_p;
  }
  data.value.pointer.ptr = (char *)mask;
  data.value._0_8_ = _Var1._M_p;
  aVar2.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::AddStringOrBlob
                 ((StringVector *)idx,(Vector *)CONCAT44(uStack_4c,(uint)local_40._M_string_length),
                  data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar2.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto result = reinterpret_cast<Vector *>(dataptr);
		return OP::template Operation<INPUT_TYPE>(input, *result);
	}